

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76496.c
# Opt level: O1

void sn76496_w_mame(void *chip,UINT8 reg,UINT8 data)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ushort uVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  iVar2 = (int)CONCAT71(in_register_00000031,reg);
  if (iVar2 == 1) {
    if (*(char *)((long)chip + 0x39) != '\0') {
      *(UINT8 *)((long)chip + 0xac) = data;
      return;
    }
  }
  else if (iVar2 == 0) {
    *(undefined4 *)((long)chip + 0xd4) = 1;
    uVar1 = (uint)data;
    if ((char)data < '\0') {
      bVar3 = data >> 4 & 7;
      *(byte *)((long)chip + 0x94) = bVar3;
      if (((bVar3 == 6) && (*(char *)((long)chip + 0x40) != '\0')) &&
         ((uVar1 & 4) != (*(ushort *)((long)chip + 0x90) & 4))) {
        *(undefined4 *)((long)chip + 0xa8) = *(undefined4 *)((long)chip + 0x2c);
      }
      *(ushort *)((long)chip + (ulong)bVar3 * 2 + 0x84) =
           (ushort)(data & 0xf) | *(ushort *)((long)chip + (ulong)bVar3 * 2 + 0x84) & 0x3f0;
    }
    else {
      bVar3 = *(byte *)((long)chip + 0x94);
    }
    if (bVar3 < 8) {
      uVar5 = (ulong)bVar3;
      if ((0xaaU >> (bVar3 & 0x1f) & 1) == 0) {
        if ((0x15U >> (bVar3 & 0x1f) & 1) == 0) {
          if (-1 < (char)data) {
            *(ushort *)((long)chip + uVar5 * 2 + 0x84) =
                 (ushort)(data & 0xf) | *(ushort *)((long)chip + uVar5 * 2 + 0x84) & 0x3f0;
          }
          uVar4 = *(ushort *)((long)chip + 0x90) & 3;
          if (uVar4 == 3) {
            iVar2 = *(int *)((long)chip + 0xb8) * 2;
          }
          else {
            iVar2 = 2 << ((byte)uVar4 | 4);
          }
          *(int *)((long)chip + 0xbc) = iVar2;
          if (*(char *)((long)chip + 0x40) == '\0') {
            *(undefined4 *)((long)chip + 0xa8) = *(undefined4 *)((long)chip + 0x2c);
            return;
          }
        }
        else {
          if (-1 < (char)data) {
            *(ushort *)((long)chip + uVar5 * 2 + 0x84) =
                 (ushort)((uVar1 & 0x3f) << 4) | *(ushort *)((long)chip + uVar5 * 2 + 0x84) & 0xf;
          }
          uVar4 = *(ushort *)((long)chip + uVar5 * 2 + 0x84);
          uVar1 = (uint)uVar4;
          if ((uVar4 == 0) && (uVar1 = (uint)uVar4, *(char *)((long)chip + 0x41) == '\0')) {
            uVar1 = 0x400;
          }
          *(uint *)((long)chip + (ulong)(bVar3 >> 1) * 4 + 0xb0) = uVar1;
          if ((bVar3 == 4) && ((~*(uint *)((long)chip + 0x90) & 3) == 0)) {
            *(int *)((long)chip + 0xbc) = *(int *)((long)chip + 0xb8) * 2;
            return;
          }
        }
      }
      else {
        *(undefined4 *)((long)chip + (ulong)(bVar3 >> 1) * 4 + 0x98) =
             *(undefined4 *)((long)chip + (ulong)(uVar1 & 0xf) * 4 + 0x44);
        if (-1 < (char)data) {
          *(ushort *)((long)chip + uVar5 * 2 + 0x84) =
               *(ushort *)((long)chip + uVar5 * 2 + 0x84) & 0x3f0 | (ushort)(uVar1 & 0xf);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void sn76496_w_mame(void *chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		sn76496_write_reg(chip, 0x00, data);
		break;
	case SN76496_W_GGST:
		sn76496_stereo_w(chip, 0x00, data);
		break;
	}
	return;
}